

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O1

int encode_decode_large(test_state *state)

{
  aec_stream *paVar1;
  size_t sVar2;
  int iVar3;
  char *__s;
  ulong uVar4;
  
  paVar1 = state->strm;
  paVar1->avail_in = state->ibuf_len;
  paVar1->avail_out = state->cbuf_len;
  paVar1->next_in = state->ubuf;
  paVar1->next_out = state->cbuf;
  iVar3 = aec_encode_init(paVar1);
  if (iVar3 == 0) {
    iVar3 = aec_encode(paVar1,1);
    if (iVar3 != 0) {
      __s = "Encode failed.";
      goto LAB_00102257;
    }
    aec_encode_end(paVar1);
    sVar2 = paVar1->total_out;
    paVar1->avail_in = sVar2;
    paVar1->avail_out = state->buf_len;
    paVar1->next_in = state->cbuf;
    paVar1->next_out = state->obuf;
    iVar3 = aec_decode_init(paVar1);
    if (iVar3 == 0) {
      iVar3 = aec_decode(paVar1,1);
      if (iVar3 == 0) {
        iVar3 = bcmp(state->ubuf,state->obuf,state->ibuf_len);
        if (iVar3 != 0) {
          printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
          printf("\nuncompressed buf");
          uVar4 = 0;
          do {
            if ((uVar4 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->ubuf[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar4 != 0x50);
          printf("\n\ncompressed buf len %li",sVar2);
          uVar4 = 0;
          do {
            if ((uVar4 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->cbuf[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar4 != 0x50);
          printf("\n\ndecompressed buf");
          uVar4 = 0;
          do {
            if ((uVar4 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->obuf[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar4 != 0x50);
          putchar(10);
          return 99;
        }
        aec_decode_end(paVar1);
        return 0;
      }
      __s = "Decode failed.";
      goto LAB_00102257;
    }
  }
  __s = "Init failed.";
LAB_00102257:
  puts(__s);
  return 99;
}

Assistant:

int encode_decode_large(struct test_state *state)
{
    int status, i;
    size_t to;
    struct aec_stream *strm = state->strm;

    strm->avail_in = state->ibuf_len;
    strm->avail_out = state->cbuf_len;
    strm->next_in = state->ubuf;
    strm->next_out = state->cbuf;

    status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    strm->avail_in = strm->total_out;
    strm->avail_out = state->buf_len;
    strm->next_in = state->cbuf;
    strm->next_out = state->obuf;
    to = strm->total_out;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %li", to);
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}